

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void raviV_op_div(lua_State *L,TValue *ra,TValue *rb,TValue *rc)

{
  TValue *io;
  lua_Number nc;
  lua_Number nb;
  TValue *rc_local;
  TValue *rb_local;
  TValue *ra_local;
  lua_State *L_local;
  
  if (rb->tt_ == 3) {
    if (rb->tt_ != 3) {
      __assert_fail("((((rb))->tt_) == (((3) | ((0) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xc0e,"void raviV_op_div(lua_State *, TValue *, TValue *, TValue *)");
    }
    nc = (rb->value_).n;
LAB_0017f97a:
    if (rc->tt_ == 3) {
      if (rc->tt_ != 3) {
        __assert_fail("((((rc))->tt_) == (((3) | ((0) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xc0e,"void raviV_op_div(lua_State *, TValue *, TValue *, TValue *)");
      }
      io = (TValue *)(rc->value_).gc;
    }
    else {
      if (rc->tt_ != 0x13) goto LAB_0017fa49;
      if (rc->tt_ != 0x13) {
        __assert_fail("((((rc))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xc0e,"void raviV_op_div(lua_State *, TValue *, TValue *, TValue *)");
      }
      io = (TValue *)(double)(rc->value_).i;
    }
    (ra->value_).n = nc / (double)io;
    ra->tt_ = 3;
  }
  else {
    if (rb->tt_ == 0x13) {
      if (rb->tt_ != 0x13) {
        __assert_fail("((((rb))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xc0e,"void raviV_op_div(lua_State *, TValue *, TValue *, TValue *)");
      }
      nc = (lua_Number)(rb->value_).i;
      goto LAB_0017f97a;
    }
LAB_0017fa49:
    luaT_trybinTM(L,rb,rc,ra,TM_DIV);
  }
  return;
}

Assistant:

void raviV_op_div(lua_State *L, TValue *ra, TValue *rb, TValue *rc) {
  lua_Number nb;
  lua_Number nc;
  if (tonumberns(rb, nb) && tonumberns(rc, nc)) {
    setfltvalue(ra, luai_numdiv(L, nb, nc));
  }
  else {
    luaT_trybinTM(L, rb, rc, ra, TM_DIV);
  }
}